

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void highbd_dr_prediction_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  long lVar1;
  uint16_t uVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar15 [32];
  
  if (0 < N) {
    lVar1 = (long)N + 0x3f;
    uVar2 = above[(long)N + 0x3f];
    auVar14._2_2_ = uVar2;
    auVar14._0_2_ = uVar2;
    auVar14._4_2_ = uVar2;
    auVar14._6_2_ = uVar2;
    auVar14._8_2_ = uVar2;
    auVar14._10_2_ = uVar2;
    auVar14._12_2_ = uVar2;
    auVar14._14_2_ = uVar2;
    auVar15._16_2_ = uVar2;
    auVar15._0_16_ = auVar14;
    auVar15._18_2_ = uVar2;
    auVar15._20_2_ = uVar2;
    auVar15._22_2_ = uVar2;
    auVar15._24_2_ = uVar2;
    auVar15._26_2_ = uVar2;
    auVar15._28_2_ = uVar2;
    auVar15._30_2_ = uVar2;
    auVar16._0_2_ = (undefined2)(N + 0x3f);
    auVar16._2_2_ = auVar16._0_2_;
    auVar16._4_2_ = auVar16._0_2_;
    auVar16._6_2_ = auVar16._0_2_;
    auVar16._8_2_ = auVar16._0_2_;
    auVar16._10_2_ = auVar16._0_2_;
    auVar16._12_2_ = auVar16._0_2_;
    auVar16._14_2_ = auVar16._0_2_;
    auVar16._16_2_ = auVar16._0_2_;
    auVar16._18_2_ = auVar16._0_2_;
    auVar16._20_2_ = auVar16._0_2_;
    auVar16._22_2_ = auVar16._0_2_;
    auVar16._24_2_ = auVar16._0_2_;
    auVar16._26_2_ = auVar16._0_2_;
    auVar16._28_2_ = auVar16._0_2_;
    auVar16._30_2_ = auVar16._0_2_;
    auVar17._8_2_ = 0x10;
    auVar17._0_8_ = 0x10001000100010;
    auVar17._10_2_ = 0x10;
    auVar17._12_2_ = 0x10;
    auVar17._14_2_ = 0x10;
    auVar17._16_2_ = 0x10;
    auVar17._18_2_ = 0x10;
    auVar17._20_2_ = 0x10;
    auVar17._22_2_ = 0x10;
    auVar17._24_2_ = 0x10;
    auVar17._26_2_ = 0x10;
    auVar17._28_2_ = 0x10;
    auVar17._30_2_ = 0x10;
    iVar9 = 0;
    auVar3 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    iVar10 = N;
    uVar8 = upsample_above;
    do {
      iVar7 = (int)uVar8 >> 6;
      iVar5 = (int)lVar1;
      iVar12 = iVar10;
      if (iVar7 < iVar5) {
        uVar4 = (ushort)(uVar8 >> 1);
        uVar18 = uVar4 & 0x1f;
        auVar19._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
        auVar19._8_2_ = uVar18;
        auVar19._10_2_ = uVar18;
        auVar19._12_2_ = uVar18;
        auVar19._14_2_ = uVar18;
        auVar19._16_2_ = uVar18;
        auVar19._18_2_ = uVar18;
        auVar19._20_2_ = uVar18;
        auVar19._22_2_ = uVar18;
        auVar19._24_2_ = uVar18;
        auVar19._26_2_ = uVar18;
        auVar19._28_2_ = uVar18;
        auVar19._30_2_ = uVar18;
        lVar13 = (long)iVar7;
        uVar11 = 0xfffffffffffffff0;
        do {
          auVar20 = auVar15;
          if ((long)(lVar13 + uVar11 + 0x10) < lVar1) {
            auVar20 = vpsubw_avx2(*(undefined1 (*) [32])(above + lVar13 + uVar11 + 0x11),
                                  *(undefined1 (*) [32])(above + lVar13 + uVar11 + 0x10));
            auVar21 = vpmullw_avx2(auVar20,auVar19);
            auVar20 = vpsllw_avx2(*(undefined1 (*) [32])(above + lVar13 + uVar11 + 0x10),5);
            auVar20 = vpaddw_avx2(auVar20,auVar17);
            auVar20 = vpaddw_avx2(auVar21,auVar20);
            auVar21 = vpsrlw_avx2(auVar20,5);
            iVar12 = (int)uVar11;
            uVar6 = iVar7 + 0x10 + iVar12;
            auVar22._0_2_ = (undefined2)uVar6;
            auVar22._2_2_ = auVar22._0_2_;
            auVar22._4_2_ = auVar22._0_2_;
            auVar22._6_2_ = auVar22._0_2_;
            auVar22._8_2_ = auVar22._0_2_;
            auVar22._10_2_ = auVar22._0_2_;
            auVar22._12_2_ = auVar22._0_2_;
            auVar22._14_2_ = auVar22._0_2_;
            auVar22 = vpaddw_avx(auVar22,auVar3);
            auVar23 = vpslldq_avx(auVar22,2);
            auVar23 = vpblendw_avx(auVar23,ZEXT416(uVar6),1);
            auVar22 = vpsrldq_avx(auVar22,0xe);
            auVar20._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar14;
            auVar20._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar22;
            auVar24._0_2_ = (undefined2)(iVar7 + 0x19 + iVar12);
            auVar24._2_2_ = auVar24._0_2_;
            auVar24._4_2_ = auVar24._0_2_;
            auVar24._6_2_ = auVar24._0_2_;
            auVar24._8_2_ = auVar24._0_2_;
            auVar24._10_2_ = auVar24._0_2_;
            auVar24._12_2_ = auVar24._0_2_;
            auVar24._14_2_ = auVar24._0_2_;
            auVar24._16_2_ = auVar24._0_2_;
            auVar24._18_2_ = auVar24._0_2_;
            auVar24._20_2_ = auVar24._0_2_;
            auVar24._22_2_ = auVar24._0_2_;
            auVar24._24_2_ = auVar24._0_2_;
            auVar24._26_2_ = auVar24._0_2_;
            auVar24._28_2_ = auVar24._0_2_;
            auVar24._30_2_ = auVar24._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar24,2);
            auVar25._0_2_ = (undefined2)(iVar7 + 0x1a + iVar12);
            auVar25._2_2_ = auVar25._0_2_;
            auVar25._4_2_ = auVar25._0_2_;
            auVar25._6_2_ = auVar25._0_2_;
            auVar25._8_2_ = auVar25._0_2_;
            auVar25._10_2_ = auVar25._0_2_;
            auVar25._12_2_ = auVar25._0_2_;
            auVar25._14_2_ = auVar25._0_2_;
            auVar25._16_2_ = auVar25._0_2_;
            auVar25._18_2_ = auVar25._0_2_;
            auVar25._20_2_ = auVar25._0_2_;
            auVar25._22_2_ = auVar25._0_2_;
            auVar25._24_2_ = auVar25._0_2_;
            auVar25._26_2_ = auVar25._0_2_;
            auVar25._28_2_ = auVar25._0_2_;
            auVar25._30_2_ = auVar25._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar25,4);
            auVar26._0_2_ = (undefined2)(iVar7 + 0x1b + iVar12);
            auVar26._2_2_ = auVar26._0_2_;
            auVar26._4_2_ = auVar26._0_2_;
            auVar26._6_2_ = auVar26._0_2_;
            auVar26._8_2_ = auVar26._0_2_;
            auVar26._10_2_ = auVar26._0_2_;
            auVar26._12_2_ = auVar26._0_2_;
            auVar26._14_2_ = auVar26._0_2_;
            auVar26._16_2_ = auVar26._0_2_;
            auVar26._18_2_ = auVar26._0_2_;
            auVar26._20_2_ = auVar26._0_2_;
            auVar26._22_2_ = auVar26._0_2_;
            auVar26._24_2_ = auVar26._0_2_;
            auVar26._26_2_ = auVar26._0_2_;
            auVar26._28_2_ = auVar26._0_2_;
            auVar26._30_2_ = auVar26._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar26,8);
            auVar27._0_2_ = (undefined2)(iVar7 + 0x1c + iVar12);
            auVar27._2_2_ = auVar27._0_2_;
            auVar27._4_2_ = auVar27._0_2_;
            auVar27._6_2_ = auVar27._0_2_;
            auVar27._8_2_ = auVar27._0_2_;
            auVar27._10_2_ = auVar27._0_2_;
            auVar27._12_2_ = auVar27._0_2_;
            auVar27._14_2_ = auVar27._0_2_;
            auVar27._16_2_ = auVar27._0_2_;
            auVar27._18_2_ = auVar27._0_2_;
            auVar27._20_2_ = auVar27._0_2_;
            auVar27._22_2_ = auVar27._0_2_;
            auVar27._24_2_ = auVar27._0_2_;
            auVar27._26_2_ = auVar27._0_2_;
            auVar27._28_2_ = auVar27._0_2_;
            auVar27._30_2_ = auVar27._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar27,0x10);
            auVar28._0_2_ = (undefined2)(iVar7 + 0x1d + iVar12);
            auVar28._2_2_ = auVar28._0_2_;
            auVar28._4_2_ = auVar28._0_2_;
            auVar28._6_2_ = auVar28._0_2_;
            auVar28._8_2_ = auVar28._0_2_;
            auVar28._10_2_ = auVar28._0_2_;
            auVar28._12_2_ = auVar28._0_2_;
            auVar28._14_2_ = auVar28._0_2_;
            auVar28._16_2_ = auVar28._0_2_;
            auVar28._18_2_ = auVar28._0_2_;
            auVar28._20_2_ = auVar28._0_2_;
            auVar28._22_2_ = auVar28._0_2_;
            auVar28._24_2_ = auVar28._0_2_;
            auVar28._26_2_ = auVar28._0_2_;
            auVar28._28_2_ = auVar28._0_2_;
            auVar28._30_2_ = auVar28._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar28,0x20);
            auVar29._0_2_ = (undefined2)(iVar7 + 0x1e + iVar12);
            auVar29._2_2_ = auVar29._0_2_;
            auVar29._4_2_ = auVar29._0_2_;
            auVar29._6_2_ = auVar29._0_2_;
            auVar29._8_2_ = auVar29._0_2_;
            auVar29._10_2_ = auVar29._0_2_;
            auVar29._12_2_ = auVar29._0_2_;
            auVar29._14_2_ = auVar29._0_2_;
            auVar29._16_2_ = auVar29._0_2_;
            auVar29._18_2_ = auVar29._0_2_;
            auVar29._20_2_ = auVar29._0_2_;
            auVar29._22_2_ = auVar29._0_2_;
            auVar29._24_2_ = auVar29._0_2_;
            auVar29._26_2_ = auVar29._0_2_;
            auVar29._28_2_ = auVar29._0_2_;
            auVar29._30_2_ = auVar29._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar29,0x40);
            auVar30._0_2_ = (undefined2)(iVar7 + 0x1f + iVar12);
            auVar30._2_2_ = auVar30._0_2_;
            auVar30._4_2_ = auVar30._0_2_;
            auVar30._6_2_ = auVar30._0_2_;
            auVar30._8_2_ = auVar30._0_2_;
            auVar30._10_2_ = auVar30._0_2_;
            auVar30._12_2_ = auVar30._0_2_;
            auVar30._14_2_ = auVar30._0_2_;
            auVar30._16_2_ = auVar30._0_2_;
            auVar30._18_2_ = auVar30._0_2_;
            auVar30._20_2_ = auVar30._0_2_;
            auVar30._22_2_ = auVar30._0_2_;
            auVar30._24_2_ = auVar30._0_2_;
            auVar30._26_2_ = auVar30._0_2_;
            auVar30._28_2_ = auVar30._0_2_;
            auVar30._30_2_ = auVar30._0_2_;
            auVar20 = vpblendw_avx2(auVar20,auVar30,0x80);
            auVar20 = vpblendd_avx2(ZEXT1632(auVar23),auVar20,0xf0);
            auVar20 = vpcmpgtw_avx2(auVar16,auVar20);
            auVar20 = vpblendvb_avx2(auVar15,auVar21,auVar20);
          }
          *(undefined1 (*) [32])((long)*(undefined1 (*) [32])((long)dst + 0x20) + uVar11 * 2) =
               auVar20;
          uVar11 = uVar11 + 0x10;
        } while (uVar11 < 0x30);
        uVar8 = uVar8 + upsample_above;
      }
      else {
        do {
          *(undefined1 (*) [32])dst = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x20) = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x40) = auVar15;
          *(undefined1 (*) [32])((long)dst + 0x60) = auVar15;
          dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      if (iVar5 <= iVar7) {
        return;
      }
      iVar9 = iVar9 + 1;
      iVar10 = iVar10 + -1;
      dst = (uint16_t *)((long)*(undefined1 (*) [32])dst + stride * 2);
    } while (iVar9 < N);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_64xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a1, a32, a16, c3f;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi16(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);
  c3f = _mm256_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift =
        _mm256_srli_epi16(_mm256_and_si256(_mm256_set1_epi16(x), c3f), 1);

    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0 = _mm256_loadu_si256((__m256i *)(above + base + j));
        a1 = _mm256_loadu_si256((__m256i *)(above + base + 1 + j));

        diff = _mm256_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi16(diff, shift);

        res = _mm256_add_epi16(a32, b);
        res = _mm256_srli_epi16(res, 5);

        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res = _mm256_blendv_epi8(a_mbase_x, res, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res);  // 16 16bit values
      }
    }
    x += dx;
  }
}